

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O2

void __thiscall
pbrt::FormattingScene::CoordinateSystem(FormattingScene *this,string *name,FileLoc loc)

{
  string local_30;
  
  indent_abi_cxx11_(&local_30,this,0);
  Printf<std::__cxx11::string,std::__cxx11::string_const&>
            ("%sCoordinateSystem \"%s\"\n",&local_30,name);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void FormattingScene::CoordinateSystem(const std::string &name, FileLoc loc) {
    Printf("%sCoordinateSystem \"%s\"\n", indent(), name);
}